

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  invalid_argument *piVar4;
  Graph *this;
  Graph *G;
  exception *e;
  int local_10 [2];
  int num_of_vert;
  
  local_10[1] = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"Give the number of vertices between 1..50: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,local_10);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"You can pass only integer type");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((0 < local_10[0]) && (local_10[0] < 0x33)) {
    this = (Graph *)operator_new(0x3528);
    Graph::Graph(this,5);
    Graph::loadGraph(this);
    Graph::printList(this);
    Graph::printPredList(this);
    Graph::isAdjoint(this);
    Graph::isLine(this);
    bVar2 = Graph::getAdjointStatus(this);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Graph is adjoint;");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Graph is not adjoint;");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    bVar2 = Graph::getLineStatus(this);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Graph is line graph;");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Graph is not line graph;");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    Graph::transformToOriginal(this);
    Graph::saveOriginalGraph(this);
    return 0;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Too low/too high number ");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int main(){
   int num_of_vert;
   cout << "Give the number of vertices between 1..50: " << endl;
   try{
      cin >> num_of_vert;
      if(not(cin.good()))
         throw invalid_argument("You can pass only integer type");
      if(num_of_vert < 1 or num_of_vert > 50)
         throw invalid_argument("Too low/too high number ");

   } catch(exception &e){
      cerr << e.what();
      exit(EXIT_FAILURE);
   }

   auto *G = new Graph();
   G->loadGraph();
   G->printList();
   G->printPredList();
   G->isAdjoint();
   G->isLine();
   if(G->getAdjointStatus())
      cout<<"Graph is adjoint;"<<endl;
   else
      cout<<"Graph is not adjoint;"<<endl;
   if(G->getLineStatus())
      cout<<"Graph is line graph;"<<endl;
   else
      cout<<"Graph is not line graph;"<<endl;;
   G->transformToOriginal();
   G->saveOriginalGraph();

   return 0;
}